

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall fmt::BasicWriter<char>::grow_buffer(BasicWriter<char> *this,size_t n)

{
  size_t index;
  char *pcVar1;
  size_t in_RSI;
  Buffer<char> *in_RDI;
  size_t size;
  size_t in_stack_ffffffffffffffd8;
  
  index = Buffer<char>::size((Buffer<char> *)in_RDI->ptr_);
  Buffer<char>::resize(in_RDI,in_stack_ffffffffffffffd8);
  pcVar1 = Buffer<char>::operator[]((Buffer<char> *)in_RDI->ptr_,index);
  pcVar1 = internal::make_ptr<char>(pcVar1,in_RSI);
  return pcVar1;
}

Assistant:

CharPtr grow_buffer(std::size_t n) {
    std::size_t size = buffer_.size();
    buffer_.resize(size + n);
    return internal::make_ptr(&buffer_[size], n);
  }